

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

void Cba_NtkMissingFonNames(Cba_Ntk_t *p,char *pPref)

{
  int iVar1;
  uint f;
  int iVar2;
  long lVar3;
  long lVar4;
  char *__assertion;
  
  if (0 < (p->vInputs).nSize) {
    lVar4 = 0;
    do {
      iVar1 = (p->vInputs).pArray[lVar4];
      lVar3 = (long)iVar1;
      if (lVar3 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                      ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if ((p->vObjFon0).nSize <= iVar1) goto LAB_003af1e5;
      if ((p->vFonName).nSize < 1) goto LAB_003af204;
      f = (p->vObjFon0).pArray[lVar3];
      if ((int)f < 1) {
        __assertion = "Cba_FonIsReal(f)";
        goto LAB_003af233;
      }
      Vec_IntFillExtra(&p->vFonName,f + 1,0);
      if ((p->vFonName).nSize <= (int)f) goto LAB_003af1e5;
      if ((p->vFonName).pArray[f] == 0) {
        if ((p->vObjName).nSize < 1) goto LAB_003af289;
        Vec_IntFillExtra(&p->vObjName,iVar1 + 1,0);
        if ((p->vObjName).nSize <= iVar1) goto LAB_003af1e5;
        Cba_FonSetName(p,f,(p->vObjName).pArray[lVar3]);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vInputs).nSize);
  }
  if (0 < (p->vOutputs).nSize) {
    lVar4 = 0;
    do {
      iVar1 = (p->vOutputs).pArray[lVar4];
      lVar3 = (long)iVar1;
      if (lVar3 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                      ,0xfe,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((p->vObjFin0).nSize <= iVar1) {
LAB_003af1e5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = (p->vObjFin0).pArray[lVar3];
      if ((long)iVar2 < 1) {
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                      ,0xfc,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((p->vFinFon).nSize <= iVar2) goto LAB_003af1e5;
      iVar2 = (p->vFinFon).pArray[iVar2];
      if (0 < (long)iVar2) {
        if ((p->vFonName).nSize < 1) {
LAB_003af204:
          __assertion = "Cba_NtkHasFonNames(p)";
LAB_003af233:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                        ,0x11d,"int Cba_FonName(Cba_Ntk_t *, int)");
        }
        Vec_IntFillExtra(&p->vFonName,iVar2 + 1,0);
        if ((p->vFonName).nSize <= iVar2) goto LAB_003af1e5;
        if ((p->vFonName).pArray[iVar2] == 0) {
          if ((p->vObjName).nSize < 1) {
LAB_003af289:
            __assert_fail("Cba_NtkHasObjNames(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cba.h"
                          ,0xf0,"int Cba_ObjName(Cba_Ntk_t *, int)");
          }
          Vec_IntFillExtra(&p->vObjName,iVar1 + 1,0);
          if ((p->vObjName).nSize <= iVar1) goto LAB_003af1e5;
          Cba_FonSetName(p,iVar2,(p->vObjName).pArray[lVar3]);
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vOutputs).nSize);
  }
  Cba_NtkAddMissingFonNames(p,pPref);
  return;
}

Assistant:

static inline void Cba_NtkMissingFonNames( Cba_Ntk_t * p, char * pPref )
{
    int i, iObj, iFon;//, NameId;
    Cba_NtkForEachPiFon( p, iObj, iFon, i )
        if ( !Cba_FonName(p, iFon) )
            Cba_FonSetName( p, iFon, Cba_ObjName(p, iObj) );
    Cba_NtkForEachPoDriverFon( p, iObj, iFon, i )
        if ( Cba_FonIsReal(iFon) && !Cba_FonName(p, iFon) )
            Cba_FonSetName( p, iFon, Cba_ObjName(p, iObj) );
//    Vec_IntForEachEntryStart( &p->vFonName, NameId, iFon, 1 )
//        if ( NameId == 0 )
//            Cba_FonSetName( p, iFon, Cba_NtkNewStrId(p, "%s%d", pPref, iFon) );
    Cba_NtkAddMissingFonNames( p, pPref );
}